

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

void read_metadata_itut_t35(AV1Decoder *pbi,uint8_t *data,size_t sz,_Bool has_obu_extension_header)

{
  int iVar1;
  undefined1 in_CL;
  size_t in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  int end_index;
  AV1Decoder *unaff_retaddr;
  int country_code_size;
  int local_20;
  undefined3 in_stack_ffffffffffffffe4;
  aom_metadata_insert_flags_t insert_flag;
  
  insert_flag = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  if (in_RDX == 0) {
    aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                       "itu_t_t35_country_code is missing");
  }
  local_20 = 1;
  if (*in_RSI == 0xff) {
    if (in_RDX == 1) {
      aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                         "itu_t_t35_country_code_extension_byte is missing");
    }
    local_20 = 2;
  }
  iVar1 = get_last_nonzero_byte_index(in_RSI,in_RDX);
  if (iVar1 < local_20) {
    aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                       "No trailing bits found in ITU-T T.35 metadata OBU");
  }
  if (in_RSI[iVar1] != 0x80) {
    aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                       "The last nonzero byte of the ITU-T T.35 metadata OBU is 0x%02x, should be 0x80."
                       ,(ulong)in_RSI[iVar1]);
  }
  alloc_read_metadata(unaff_retaddr,(OBU_METADATA_TYPE)((ulong)in_RDI >> 0x20),in_RSI,in_RDX,
                      insert_flag);
  return;
}

Assistant:

static void read_metadata_itut_t35(AV1Decoder *const pbi, const uint8_t *data,
                                   size_t sz, bool has_obu_extension_header) {
  if (sz == 0) {
    aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                       "itu_t_t35_country_code is missing");
  }
  int country_code_size = 1;
  if (*data == 0xFF) {
    if (sz == 1) {
      aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                         "itu_t_t35_country_code_extension_byte is missing");
    }
    ++country_code_size;
  }
  int end_index = get_last_nonzero_byte_index(data, sz);
  if (end_index < country_code_size) {
    aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                       "No trailing bits found in ITU-T T.35 metadata OBU");
  }
  // itu_t_t35_payload_bytes is byte aligned. Section 6.7.2 of the spec says:
  //   itu_t_t35_payload_bytes shall be bytes containing data registered as
  //   specified in Recommendation ITU-T T.35.
  // Therefore the first trailing byte should be 0x80.
  if (data[end_index] != 0x80) {
    aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                       "The last nonzero byte of the ITU-T T.35 metadata OBU "
                       "is 0x%02x, should be 0x80.",
                       data[end_index]);
  }
  alloc_read_metadata(pbi, OBU_METADATA_TYPE_ITUT_T35, data, end_index,
                      has_obu_extension_header
                          ? AOM_MIF_ANY_FRAME_LAYER_SPECIFIC
                          : AOM_MIF_ANY_FRAME);
}